

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

int symbol_parse_type_function_return(lgx_ast_t *ast,lgx_ast_node_t *node,lgx_type_function_t *fun)

{
  int iVar1;
  int iVar2;
  lgx_type_t *type;
  
  if (*(char *)node == '\"') {
    type = &fun->ret;
    iVar1 = symbol_parse_type(ast,node,type);
    iVar2 = 1;
    if ((iVar1 == 0) && (iVar2 = 0, type->type != T_UNKNOWN)) {
      iVar1 = lgx_type_is_definite(type);
      if (iVar1 == 0) {
        symbol_error(ast,node,"return value has incomplete type\n");
        iVar2 = 1;
      }
    }
    return iVar2;
  }
  __assert_fail("node->type == TYPE_EXPRESSION",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                ,0xd3,
                "int symbol_parse_type_function_return(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
               );
}

Assistant:

static int symbol_parse_type_function_return(lgx_ast_t* ast, lgx_ast_node_t* node, lgx_type_function_t* fun) {
    assert(node->type == TYPE_EXPRESSION);

    if (symbol_parse_type(ast, node, &fun->ret)) {
        return 1;
    }

    if (fun->ret.type != T_UNKNOWN && !lgx_type_is_definite(&fun->ret)) {
        symbol_error(ast, node, "return value has incomplete type\n");
        return 1;
    }

    return 0;
}